

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean revive_nasty(int x,int y,char *msg)

{
  obj *poVar1;
  boolean bVar2;
  monst *local_48;
  monst *local_40;
  char local_33;
  coord local_32;
  boolean revived;
  monst *pmStack_30;
  coord cc;
  monst *mtmp;
  obj *otmp2;
  obj *otmp;
  char *msg_local;
  int y_local;
  int x_local;
  
  local_33 = '\0';
  poVar1 = level->objects[x][y];
  while( true ) {
    otmp2 = poVar1;
    if (otmp2 == (obj *)0x0) break;
    poVar1 = (otmp2->v).v_nexthere;
    if ((otmp2->otyp == 0x10e) &&
       ((((((long)otmp2->corpsenm & 0x3ffffffffffffffU) == 0x144 ||
          (((long)otmp2->corpsenm & 0x3ffffffffffffffU) == 0x146)) ||
         (((long)otmp2->corpsenm & 0x3ffffffffffffffU) == 0x145)) || (otmp2->corpsenm == 0x128)))) {
      if ((level->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_40 = (monst *)0x0;
      }
      else {
        local_40 = level->monsters[x][y];
      }
      pmStack_30 = local_40;
      if ((local_40 != (monst *)0x0) &&
         (bVar2 = enexto(&local_32,level,(xchar)x,(xchar)y,local_40->data), bVar2 != '\0')) {
        rloc_to(pmStack_30,level,(int)local_32.x,(int)local_32.y);
      }
      if (msg != (char *)0x0) {
        Norep("%s",msg);
      }
      local_33 = revive_corpse(otmp2);
    }
  }
  if (local_33 != '\0') {
    if ((level->monsters[x][y] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
      local_48 = (monst *)0x0;
    }
    else {
      local_48 = level->monsters[x][y];
    }
    pmStack_30 = local_48;
    if (((local_48 != (monst *)0x0) && (bVar2 = goodpos(level,x,y,local_48,0), bVar2 == '\0')) &&
       (bVar2 = enexto(&local_32,level,(xchar)x,(xchar)y,pmStack_30->data), bVar2 != '\0')) {
      rloc_to(pmStack_30,level,(int)local_32.x,(int)local_32.y);
    }
  }
  return local_33;
}

Assistant:

boolean revive_nasty(int x, int y, const char *msg)
{
    struct obj *otmp, *otmp2;
    struct monst *mtmp;
    coord cc;
    boolean revived = FALSE;

    for (otmp = level->objects[x][y]; otmp; otmp = otmp2) {
	otmp2 = otmp->nexthere;
	if (otmp->otyp == CORPSE &&
	    (is_rider(&mons[otmp->corpsenm]) ||
	     otmp->corpsenm == PM_WIZARD_OF_YENDOR)) {
	    /* move any living monster already at that location */
	    if ((mtmp = m_at(level, x,y)) && enexto(&cc, level, x, y, mtmp->data))
		rloc_to(mtmp, level, cc.x, cc.y);
	    if (msg) Norep("%s", msg);
	    revived = revive_corpse(otmp);
	}
    }

    /* this location might not be safe, if not, move revived monster */
    if (revived) {
	mtmp = m_at(level, x,y);
	if (mtmp && !goodpos(level, x, y, mtmp, 0) &&
	    enexto(&cc, level, x, y, mtmp->data)) {
	    rloc_to(mtmp, level, cc.x, cc.y);
	}
	/* else impossible? */
    }

    return revived;
}